

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinImporter::InternReadFile
          (AssbinImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  unsigned_short uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  void *pvVar6;
  undefined4 extraout_var_02;
  uint8_t *puVar7;
  DeadlyImportError *pDVar8;
  ulong uVar9;
  allocator<char> local_69;
  uLongf uncompressedSize;
  MemoryIOStream io;
  IOStream *stream;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&io,"rb",(allocator<char> *)&uncompressedSize);
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,io.super_IOStream._vptr_IOStream);
  stream = (IOStream *)CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::~string((string *)&io);
  if (stream != (IOStream *)0x0) {
    (*stream->_vptr_IOStream[4])(stream,0x2c,1);
    uVar3 = Read<unsigned_int>(stream);
    uVar4 = Read<unsigned_int>(stream);
    if ((uVar3 != 1) || (uVar4 != 0)) {
      pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&io,"Invalid version, data format not compatible!",
                 (allocator<char> *)&uncompressedSize);
      DeadlyImportError::DeadlyImportError(pDVar8,(string *)&io);
      __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    Read<unsigned_int>(stream);
    Read<unsigned_int>(stream);
    uVar1 = Read<unsigned_short>(stream);
    this->shortened = uVar1 != 0;
    uVar1 = Read<unsigned_short>(stream);
    this->compressed = uVar1 != 0;
    if (this->shortened == true) {
      pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&io,"Shortened binaries are not supported!",
                 (allocator<char> *)&uncompressedSize);
      DeadlyImportError::DeadlyImportError(pDVar8,(string *)&io);
      __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    (*stream->_vptr_IOStream[4])(stream,0x100,1);
    (*stream->_vptr_IOStream[4])(stream,0x80,1);
    (*stream->_vptr_IOStream[4])(stream,0x40,1);
    if (this->compressed == true) {
      uVar3 = Read<unsigned_int>(stream);
      uncompressedSize = (ulong)uVar3;
      iVar2 = (*stream->_vptr_IOStream[6])(stream);
      iVar5 = (*stream->_vptr_IOStream[5])(stream);
      uVar9 = CONCAT44(extraout_var_00,iVar2) - CONCAT44(extraout_var_01,iVar5);
      pvVar6 = operator_new__(uVar9);
      iVar2 = (*stream->_vptr_IOStream[2])(stream,pvVar6,1,uVar9);
      if (CONCAT44(extraout_var_02,iVar2) != uVar9) {
        __assert_fail("len == compressedSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Assbin/AssbinLoader.cpp"
                      ,0x2c3,
                      "virtual void Assimp::AssbinImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                     );
      }
      puVar7 = (uint8_t *)operator_new__((ulong)uVar3);
      iVar2 = uncompress(puVar7,&uncompressedSize,pvVar6,uVar9);
      if (iVar2 != 0) {
        operator_delete__(puVar7);
        operator_delete__(pvVar6);
        (*pIOHandler->_vptr_IOSystem[5])(pIOHandler,stream);
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&io,"Zlib decompression failed.",&local_69);
        DeadlyImportError::DeadlyImportError(pDVar8,(string *)&io);
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      io.super_IOStream._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_00729b60;
      io.length = uncompressedSize;
      io.pos = 0;
      io.own = false;
      io.buffer = puVar7;
      ReadBinaryScene(this,&io.super_IOStream,pScene);
      operator_delete__(puVar7);
      operator_delete__(pvVar6);
      MemoryIOStream::~MemoryIOStream(&io);
    }
    else {
      ReadBinaryScene(this,stream,pScene);
    }
    (*pIOHandler->_vptr_IOSystem[5])(pIOHandler,stream);
  }
  return;
}

Assistant:

void AssbinImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler ) {
    IOStream * stream = pIOHandler->Open(pFile,"rb");
    if (nullptr == stream) {
        return;
    }

    // signature
    stream->Seek( 44, aiOrigin_CUR );

    unsigned int versionMajor = Read<unsigned int>(stream);
    unsigned int versionMinor = Read<unsigned int>(stream);
    if (versionMinor != ASSBIN_VERSION_MINOR || versionMajor != ASSBIN_VERSION_MAJOR) {
        throw DeadlyImportError( "Invalid version, data format not compatible!" );
    }

    /*unsigned int versionRevision =*/ Read<unsigned int>(stream);
    /*unsigned int compileFlags =*/ Read<unsigned int>(stream);

    shortened = Read<uint16_t>(stream) > 0;
    compressed = Read<uint16_t>(stream) > 0;

    if (shortened)
        throw DeadlyImportError( "Shortened binaries are not supported!" );

    stream->Seek( 256, aiOrigin_CUR ); // original filename
    stream->Seek( 128, aiOrigin_CUR ); // options
    stream->Seek( 64, aiOrigin_CUR ); // padding

    if (compressed) {
        uLongf uncompressedSize = Read<uint32_t>(stream);
        uLongf compressedSize = static_cast<uLongf>(stream->FileSize() - stream->Tell());

        unsigned char * compressedData = new unsigned char[ compressedSize ];
        size_t len = stream->Read( compressedData, 1, compressedSize );
        ai_assert(len == compressedSize);

        unsigned char * uncompressedData = new unsigned char[ uncompressedSize ];

        int res = uncompress( uncompressedData, &uncompressedSize, compressedData, (uLong) len );
        if(res != Z_OK)
        {
            delete [] uncompressedData;
            delete [] compressedData;
            pIOHandler->Close(stream);
            throw DeadlyImportError("Zlib decompression failed.");
        }

        MemoryIOStream io( uncompressedData, uncompressedSize );

        ReadBinaryScene(&io,pScene);

        delete[] uncompressedData;
        delete[] compressedData;
    } else {
        ReadBinaryScene(stream,pScene);
    }

    pIOHandler->Close(stream);
}